

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O1

bool __thiscall
slang::DiagnosticEngine::issueImpl
          (DiagnosticEngine *this,Diagnostic *diagnostic,DiagnosticSeverity severity)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  pointer pSVar4;
  SourceManager *this_00;
  group_type_pointer pgVar5;
  value_type_pointer pBVar6;
  path *ppVar7;
  pointer psVar8;
  element_type *peVar9;
  Diagnostic *pDVar10;
  bool bVar11;
  bool bVar12;
  DiagnosticSeverity DVar13;
  SourceLocation SVar14;
  path *ppVar15;
  SourceRange *range;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  ulong hash;
  path *pattern;
  long lVar22;
  path *ppVar23;
  __extent_storage<18446744073709551615UL> _Var24;
  byte bVar25;
  shared_ptr<slang::DiagnosticClient> *client;
  pointer psVar26;
  Diagnostic *note;
  Diagnostic *diagnostic_00;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  undefined1 auVar31 [16];
  span<const_slang::SourceRange,_18446744073709551615UL> ranges;
  SourceLocation loc;
  string message;
  locator res;
  SmallVector<slang::SourceLocation,_8UL> expansionLocs;
  SourceLocation local_170;
  ulong local_168;
  SourceLocation local_160;
  DiagnosticSeverity local_154;
  flat_hash_set<BufferID> *local_150;
  string local_148;
  ulong local_128;
  undefined1 local_120 [16];
  long lStack_110;
  undefined1 local_108 [16];
  SourceLocation local_f8;
  undefined5 uStack_f0;
  undefined3 uStack_eb;
  undefined8 local_e8;
  DiagnosticSeverity local_e0;
  byte local_dc;
  SmallVectorBase<slang::SourceLocation> local_88 [2];
  
  local_88[0].data_ = (pointer)local_88[0].firstElement;
  local_88[0].len = 0;
  local_88[0].cap = 8;
  local_170 = diagnostic->location;
  bVar25 = 0;
  local_160 = (SourceLocation)diagnostic;
  local_154 = severity;
  if (local_170 == (SourceLocation)0xffffffffffffffff) {
    local_168 = 0;
  }
  else {
    local_168 = 0;
    while (bVar11 = SourceManager::isMacroLoc(this->sourceManager,local_170), SVar14 = local_170,
          bVar11) {
      bVar11 = SourceManager::isMacroArgLoc(this->sourceManager,local_170);
      if (bVar11) {
        local_120._0_8_ = SourceManager::getExpansionLoc(this->sourceManager,local_170);
        SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation>
                  (local_88,(SourceLocation *)local_120);
        local_170 = SourceManager::getOriginalLoc(this->sourceManager,local_170);
      }
      else {
        SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation_const&>
                  (local_88,&local_170);
        local_170 = SourceManager::getExpansionLoc(this->sourceManager,local_170);
      }
      pSVar4 = *(pointer *)((long)local_160 + 0x18);
      lVar22 = *(long *)((long)local_160 + 0x20);
      this_00 = this->sourceManager;
      bVar11 = SourceManager::isMacroArgLoc(this_00,SVar14);
      if (bVar11) {
        SVar14 = SourceManager::getExpansionLoc(this_00,SVar14);
        _Var24._M_extent_value = lVar22 - (long)pSVar4 >> 4;
        local_120._0_8_ = local_108;
        stack0xfffffffffffffee8 = ZEXT816(8) << 0x40;
        ranges._M_extent._M_extent_value = _Var24._M_extent_value;
        ranges._M_ptr = pSVar4;
        mapSourceRanges(this,SVar14,ranges,(SmallVectorBase<slang::SourceRange> *)local_120,false);
        if ((ulong)local_120._8_8_ < _Var24._M_extent_value) {
          bVar11 = false;
        }
        else {
          bVar11 = local_120._8_8_ == 0;
          if (!bVar11) {
            uVar16 = SVar14._0_4_ & 0xfffffff;
            uVar17 = (ulong)SVar14 >> 0x1c;
            bVar11 = false;
            SVar14 = (SourceLocation)local_120._0_8_;
            do {
              uVar21 = (uint)*(ulong *)SVar14 & 0xfffffff;
              bVar20 = -(uVar16 < uVar21) | 1;
              if ((uVar16 == uVar21) &&
                 (uVar18 = *(ulong *)SVar14 >> 0x1c, bVar20 = -(uVar17 < uVar18) | 1,
                 uVar17 == uVar18)) {
                bVar20 = bVar25;
              }
              if ((char)bVar20 < '\0') break;
              uVar21 = (uint)*(ulong *)((long)SVar14 + 8) & 0xfffffff;
              bVar20 = -(uVar16 < uVar21) | 1;
              if ((uVar16 == uVar21) &&
                 (uVar18 = *(ulong *)((long)SVar14 + 8) >> 0x1c, bVar20 = -(uVar17 < uVar18) | 1,
                 uVar17 == uVar18)) {
                bVar20 = 0;
              }
              if (-1 < (char)bVar20) break;
              SVar14 = (SourceLocation)((long)SVar14 + 0x10);
              bVar11 = SVar14 == (SourceLocation)(local_120._8_8_ * 0x10 + local_120._0_8_);
            } while (!bVar11);
          }
        }
        if ((undefined1 *)local_120._0_8_ != local_108) {
          operator_delete((void *)local_120._0_8_);
        }
      }
      else {
        bVar11 = false;
      }
      if (bVar11) {
        local_168 = local_88[0].len;
      }
    }
    local_148._M_dataplus._M_p._0_4_ = local_170._0_4_ & 0xfffffff;
    local_150 = &this->reportedIncludeStack;
    hash = SUB168(ZEXT416((uint)local_148._M_dataplus._M_p) * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(ZEXT416((uint)local_148._M_dataplus._M_p) * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar18 = hash >> ((byte)(this->reportedIncludeStack).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                            .arrays.groups_size_index & 0x3f);
    pgVar5 = (this->reportedIncludeStack).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
             .arrays.groups_;
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    pBVar6 = (this->reportedIncludeStack).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
             .arrays.elements_;
    local_128 = (this->reportedIncludeStack).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                .arrays.groups_size_mask;
    uVar19 = 0;
    uVar17 = uVar18;
    do {
      pgVar2 = pgVar5 + uVar17;
      uVar27 = (uchar)uVar3;
      auVar31[0] = -(pgVar2->m[0].n == uVar27);
      uVar28 = (uchar)((uint)uVar3 >> 8);
      auVar31[1] = -(pgVar2->m[1].n == uVar28);
      uVar29 = (uchar)((uint)uVar3 >> 0x10);
      auVar31[2] = -(pgVar2->m[2].n == uVar29);
      uVar30 = (uchar)((uint)uVar3 >> 0x18);
      auVar31[3] = -(pgVar2->m[3].n == uVar30);
      auVar31[4] = -(pgVar2->m[4].n == uVar27);
      auVar31[5] = -(pgVar2->m[5].n == uVar28);
      auVar31[6] = -(pgVar2->m[6].n == uVar29);
      auVar31[7] = -(pgVar2->m[7].n == uVar30);
      auVar31[8] = -(pgVar2->m[8].n == uVar27);
      auVar31[9] = -(pgVar2->m[9].n == uVar28);
      auVar31[10] = -(pgVar2->m[10].n == uVar29);
      auVar31[0xb] = -(pgVar2->m[0xb].n == uVar30);
      auVar31[0xc] = -(pgVar2->m[0xc].n == uVar27);
      auVar31[0xd] = -(pgVar2->m[0xd].n == uVar28);
      auVar31[0xe] = -(pgVar2->m[0xe].n == uVar29);
      auVar31[0xf] = -(pgVar2->m[0xf].n == uVar30);
      for (uVar16 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe); uVar16 != 0;
          uVar16 = uVar16 - 1 & uVar16) {
        uVar21 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        if ((uint)local_148._M_dataplus._M_p == pBVar6[uVar17 * 0xf + (ulong)uVar21].id) {
          if (pBVar6 + uVar17 * 0xf + (ulong)uVar21 == (value_type_pointer)0x0) goto LAB_006392e7;
          bVar25 = 0;
          goto LAB_0063931f;
        }
      }
      if ((pgVar5[uVar17].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
      lVar22 = uVar17 + uVar19;
      uVar19 = uVar19 + 1;
      uVar17 = lVar22 + 1U & local_128;
    } while (uVar19 <= local_128);
LAB_006392e7:
    if ((this->reportedIncludeStack).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
        .size_ctrl.size <
        (this->reportedIncludeStack).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
      ::nosize_unchecked_emplace_at<slang::BufferID>
                ((locator *)local_120,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                  *)local_150,(arrays_type *)local_150,uVar18,hash,(BufferID *)&local_148);
      psVar1 = &(this->reportedIncludeStack).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
      ::unchecked_emplace_with_rehash<slang::BufferID>
                ((locator *)local_120,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
                  *)local_150,hash,(BufferID *)&local_148);
    }
    bVar25 = 1;
LAB_0063931f:
    DVar13 = getDefaultSeverity(*(DiagCode *)((long)local_160 + 0x58));
    if (DVar13 == Warning) {
      if ((this->ignoreWarnPatterns).
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->ignoreWarnPatterns).
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppVar15 = SourceManager::getFullPath_abi_cxx11_
                            (this->sourceManager,(BufferID)(local_170._0_4_ & 0xfffffff));
        ppVar23 = (this->ignoreWarnPatterns).
                  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar7 = (this->ignoreWarnPatterns).
                 super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        while ((bVar11 = ppVar23 != ppVar7, bVar11 &&
               (bVar12 = svGlobMatches(ppVar15,ppVar23), !bVar12))) {
          ppVar23 = ppVar23 + 1;
        }
        if (!bVar11) goto LAB_00639399;
LAB_00639392:
        bVar11 = false;
        goto LAB_00639578;
      }
LAB_00639399:
      if (((local_168 < local_88[0].len) &&
          ((this->ignoreMacroWarnPatterns).
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (this->ignoreMacroWarnPatterns).
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish)) &&
         (SVar14 = SourceManager::getFullyOriginalLoc
                             (this->sourceManager,local_88[0].data_[local_168]),
         (this->ignoreMacroWarnPatterns).
         super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->ignoreMacroWarnPatterns).
         super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        ppVar15 = SourceManager::getFullPath_abi_cxx11_
                            (this->sourceManager,(BufferID)(SVar14._0_4_ & 0xfffffff));
        ppVar23 = (this->ignoreMacroWarnPatterns).
                  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar7 = (this->ignoreMacroWarnPatterns).
                 super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        while ((bVar11 = ppVar23 != ppVar7, bVar11 &&
               (bVar12 = svGlobMatches(ppVar15,ppVar23), !bVar12))) {
          ppVar23 = ppVar23 + 1;
        }
        if (bVar11) goto LAB_00639392;
      }
    }
  }
  SVar14 = local_160;
  formatMessage_abi_cxx11_(&local_148,this,(Diagnostic *)local_160);
  local_120._0_8_ = SVar14;
  lStack_110 = local_88[0].len - local_168;
  local_120._8_8_ = local_88[0].data_ + local_168;
  local_108._8_8_ = *(long *)((long)SVar14 + 0x20) - *(long *)((long)SVar14 + 0x18) >> 4;
  local_108._0_8_ = *(long *)((long)SVar14 + 0x18);
  local_f8 = local_170;
  local_e0 = local_154;
  local_e8 = CONCAT44(local_148._M_dataplus._M_p._4_4_,(uint)local_148._M_dataplus._M_p);
  uStack_f0 = (undefined5)local_148._M_string_length;
  uStack_eb = (undefined3)(local_148._M_string_length >> 0x28);
  psVar26 = (this->clients).
            super__Vector_base<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar8 = (this->clients).
           super__Vector_base<std::shared_ptr<slang::DiagnosticClient>,_std::allocator<std::shared_ptr<slang::DiagnosticClient>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_dc = bVar25;
  if (psVar26 != psVar8) {
    do {
      peVar9 = (psVar26->super___shared_ptr<slang::DiagnosticClient,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*peVar9->_vptr_DiagnosticClient[2])(peVar9,local_120);
      psVar26 = psVar26 + 1;
    } while (psVar26 != psVar8);
  }
  pDVar10 = *(Diagnostic **)((long)local_160 + 0x38);
  for (diagnostic_00 = *(Diagnostic **)((long)local_160 + 0x30); diagnostic_00 != pDVar10;
      diagnostic_00 = diagnostic_00 + 1) {
    if (((diagnostic_00->location != (SourceLocation)0xffffffffffffffff) ||
        (diagnostic_00->code == (DiagCode)0xe70006)) || (diagnostic_00->code == (DiagCode)0x80001))
    {
      issue(this,diagnostic_00);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_148._M_dataplus._M_p._4_4_,(uint)local_148._M_dataplus._M_p) !=
      &local_148.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_148._M_dataplus._M_p._4_4_,(uint)local_148._M_dataplus._M_p),
                    local_148.field_2._M_allocated_capacity + 1);
  }
  bVar11 = true;
LAB_00639578:
  if (local_88[0].data_ != (pointer)local_88[0].firstElement) {
    operator_delete(local_88[0].data_);
  }
  return bVar11;
}

Assistant:

bool DiagnosticEngine::issueImpl(const Diagnostic& diagnostic, DiagnosticSeverity severity) {
    // Walk out until we find a location for this diagnostic that isn't inside a macro.
    SmallVector<SourceLocation, 8> expansionLocs;
    SourceLocation loc = diagnostic.location;
    size_t ignoreExpansionsUntil = 0;
    bool showIncludeStack = false;

    if (loc != SourceLocation::NoLocation) {
        while (sourceManager.isMacroLoc(loc)) {
            SourceLocation prevLoc = loc;
            if (sourceManager.isMacroArgLoc(loc)) {
                expansionLocs.push_back(sourceManager.getExpansionLoc(loc));
                loc = sourceManager.getOriginalLoc(loc);
            }
            else {
                expansionLocs.push_back(loc);
                loc = sourceManager.getExpansionLoc(loc);
            }

            if (checkMacroArgRanges(*this, prevLoc, diagnostic.ranges))
                ignoreExpansionsUntil = expansionLocs.size();
        }

        showIncludeStack = reportedIncludeStack.emplace(loc.buffer()).second;

        auto checkSuppressed = [&](const std::vector<fs::path>& patterns, SourceLocation loc) {
            if (patterns.empty())
                return false;

            auto& path = sourceManager.getFullPath(loc.buffer());
            for (auto& pattern : patterns) {
                if (svGlobMatches(path, pattern))
                    return true;
            }
            return false;
        };

        if (getDefaultSeverity(diagnostic.code) == DiagnosticSeverity::Warning) {
            if (checkSuppressed(ignoreWarnPatterns, loc))
                return false;

            if (ignoreExpansionsUntil < expansionLocs.size() && !ignoreMacroWarnPatterns.empty()) {
                auto originalLoc = sourceManager.getFullyOriginalLoc(
                    expansionLocs[ignoreExpansionsUntil]);

                if (checkSuppressed(ignoreMacroWarnPatterns, originalLoc))
                    return false;
            }
        }
    }

    std::string message = formatMessage(diagnostic);

    ReportedDiagnostic report(diagnostic);
    report.expansionLocs = std::span<SourceLocation>(expansionLocs).subspan(ignoreExpansionsUntil);
    report.ranges = diagnostic.ranges;
    report.location = loc;
    report.severity = severity;
    report.formattedMessage = message;
    report.shouldShowIncludeStack = showIncludeStack;

    for (auto& client : clients)
        client->report(report);

    // Notes are ignored if location is "NoLocation" since they frequently make no
    // sense without location information.
    for (const Diagnostic& note : diagnostic.notes) {
        // At some point we should figure out how to not hardcode these special cases
        // that allow notes to be issued without a location.
        if (note.location != SourceLocation::NoLocation || note.code == diag::NoteFromHere2 ||
            note.code == diag::NoteUdpCoverage) {
            issue(note);
        }
    }

    return true;
}